

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppp.cpp
# Opt level: O3

void __thiscall pg::PPPSolver::run(PPPSolver *this)

{
  Game *pGVar1;
  int *piVar2;
  uint64_t *puVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer piVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  uint to;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  int *__s;
  int *piVar12;
  ostream *poVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint i;
  pointer *ppiVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  
  pGVar1 = (this->super_PPSolver).super_Solver.game;
  uVar16 = pGVar1->n_vertices;
  piVar2 = pGVar1->_priority;
  iVar14 = *(int *)((long)piVar2 + ((long)((uVar16 << 0x20) + -0x100000000) >> 0x1e));
  (this->super_PPSolver).max_prio = iVar14;
  uVar19 = (ulong)(iVar14 + 1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar19;
  uVar9 = SUB168(auVar7 * ZEXT816(0x18),0);
  uVar15 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar15 = 0xffffffffffffffff;
  }
  if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar15);
  *puVar10 = uVar19;
  if (iVar14 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar10 + 1),0,
           ((uVar9 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  (this->super_PPSolver).regions = (vector<int,_std::allocator<int>_> *)(puVar10 + 1);
  uVar9 = -(ulong)(uVar16 >> 0x3e != 0) | uVar16 * 4;
  piVar11 = (int *)operator_new__(uVar9);
  (this->super_PPSolver).region = piVar11;
  __s = (int *)operator_new__(uVar9);
  uVar19 = uVar19 << 2;
  (this->super_PPSolver).strategy = __s;
  if (iVar14 < -1) {
    uVar19 = 0xffffffffffffffff;
  }
  piVar12 = (int *)operator_new__(uVar19);
  (this->super_PPSolver).inverse = piVar12;
  if (0 < (long)uVar16) {
    uVar9 = 0;
    puVar3 = ((this->super_PPSolver).super_Solver.disabled)->_bits;
    do {
      iVar14 = -2;
      if ((puVar3[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
        iVar14 = piVar2[uVar9];
      }
      piVar11[uVar9] = iVar14;
      uVar9 = uVar9 + 1;
    } while (uVar16 != uVar9);
    if (0 < (long)uVar16) {
      memset(__s,0xff,uVar16 * 4);
    }
  }
  i = (int)uVar16 - 1;
  this->reset0 = -1;
  this->reset1 = -1;
  (this->super_PPSolver).promotions = 0;
joined_r0x0015bf93:
  while (-1 < (int)i) {
    piVar2 = ((this->super_PPSolver).super_Solver.game)->_priority;
    uVar18 = piVar2[i];
    while (uVar16 = (ulong)i, piVar2[uVar16] == uVar18) {
      if (((((this->super_PPSolver).super_Solver.disabled)->_bits[i >> 6] >> (uVar16 & 0x3f) & 1) ==
           0) && ((this->super_PPSolver).region[uVar16] <= (int)uVar18)) {
        (this->super_PPSolver).inverse[(int)uVar18] = i;
        if ((uVar18 & 1) == 0) {
          if (this->reset0 < (int)uVar18) goto LAB_0015c065;
          this->reset0 = uVar18 - 2;
LAB_0015c075:
          bVar8 = true;
        }
        else {
          if ((int)uVar18 <= this->reset1) {
            this->reset1 = uVar18 - 2;
            goto LAB_0015c075;
          }
LAB_0015c065:
          bVar8 = false;
        }
        bVar8 = PPSolver::setupRegion(&this->super_PPSolver,i,uVar18,bVar8);
        if (bVar8) goto LAB_0015c090;
        goto LAB_0015c120;
      }
      bVar8 = (int)i < 1;
      i = i - 1;
      if (bVar8) goto LAB_0015c1b5;
    }
    pvVar4 = (this->super_PPSolver).regions;
    if (pvVar4[(int)uVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        pvVar4[(int)uVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      PPSolver::resetRegion(&this->super_PPSolver,uVar18);
      if ((uVar18 & 1) == 0) {
        this->reset0 = uVar18 - 2;
      }
      else {
        this->reset1 = uVar18 - 2;
      }
    }
  }
LAB_0015c1b5:
  pvVar4 = (this->super_PPSolver).regions;
  if (pvVar4 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar5 = pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar17 = &pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar5 != (pointer)0x0) {
      lVar20 = (long)piVar5 * 0x18;
      do {
        pvVar6 = *(void **)((long)&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar20);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,*(long *)((long)ppiVar17 + lVar20) - (long)pvVar6);
        }
        lVar20 = lVar20 + -0x18;
      } while (lVar20 != 0);
    }
    operator_delete__(ppiVar17,(long)piVar5 * 0x18 + 8);
  }
  piVar2 = (this->super_PPSolver).region;
  if (piVar2 != (int *)0x0) {
    operator_delete__(piVar2);
  }
  piVar2 = (this->super_PPSolver).strategy;
  if (piVar2 != (int *)0x0) {
    operator_delete__(piVar2);
  }
  piVar2 = (this->super_PPSolver).inverse;
  if (piVar2 != (int *)0x0) {
    operator_delete__(piVar2);
  }
  poVar13 = (this->super_PPSolver).super_Solver.logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"solved with ",0xc);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,(this->super_PPSolver).promotions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," promotions.",0xc);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  return;
LAB_0015c090:
  if (1 < (this->super_PPSolver).super_Solver.trace) {
    PPSolver::reportRegion(&this->super_PPSolver,uVar18);
  }
  to = (*(this->super_PPSolver).super_Solver._vptr_Solver[4])(this,(ulong)i,(ulong)uVar18);
  if (to == 0xffffffff) {
    PPSolver::setDominion(&this->super_PPSolver,uVar18);
    pGVar1 = (this->super_PPSolver).super_Solver.game;
    i = (int)pGVar1->n_vertices - 1;
    uVar18 = pGVar1->_priority[(int)i];
    this->reset0 = uVar18;
    this->reset1 = uVar18;
    if ((uVar18 & 1) == 0) {
      this->reset1 = uVar18 - 1;
    }
    else {
      this->reset0 = uVar18 - 1;
    }
    goto joined_r0x0015bf93;
  }
  if (to == 0xfffffffe) goto LAB_0015c13b;
  PPSolver::promote(&this->super_PPSolver,uVar18,to);
  if ((to & 1) == 0) {
    if (this->reset1 < (int)to) {
      this->reset1 = to - 1;
    }
  }
  else if (this->reset0 < (int)to) {
    this->reset0 = to - 1;
  }
  i = (this->super_PPSolver).inverse[(int)to];
  uVar18 = to;
  goto LAB_0015c090;
LAB_0015c13b:
  if ((int)i < 0) goto LAB_0015c1b5;
  while ((int)uVar18 <= ((this->super_PPSolver).super_Solver.game)->_priority[i]) {
    bVar8 = (int)i < 1;
    i = i - 1;
    if (bVar8) goto LAB_0015c1b5;
  }
  goto joined_r0x0015bf93;
LAB_0015c120:
  if (((this->super_PPSolver).super_Solver.game)->_priority[i] != uVar18) goto joined_r0x0015bf93;
  bVar8 = (int)i < 1;
  i = i - 1;
  if (bVar8) goto LAB_0015c1b5;
  goto LAB_0015c120;
}

Assistant:

void
PPPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize reset values
    reset0 = -1;
    reset1 = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) {
                resetRegion(p);
                // but then we must also reset everything lower...
                if (p&1) reset1 = p-2;
                else reset0 = p-2;
            }
            continue;
        }

        inverse[p] = i;

        // PPP: reset if lower than value
        bool reset = false;
        if (p&1) {
            if (p <= reset1) {
                reset = true;
                reset1 = p-2;
            }
        } else {
            if (p <= reset0) {
                reset = true;
                reset0 = p-2;
            }
        }
        if (setupRegion(i, p, reset)) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) >= p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion, return
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    reset0 = priority(nodecount()-1);
                    reset1 = priority(nodecount()-1);
                    if (reset0&1) reset0--;
                    else reset1--;
                    break;
                } else {
                    // found promotion, promote
                    promote(p, res);
                    // increase reset value if needed
                    if (res&1) {
                        if (res > reset0) reset0 = res-1;
                    } else {
                        if (res > reset1) reset1 = res-1;
                    }
                    // continue inner loop with higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}